

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::i64_Load32s(w3Interp *this)

{
  int *piVar1;
  w3StackValue local_38;
  
  piVar1 = (int *)LoadStore(this,4);
  local_38.value.value = (Value)(long)*piVar1;
  local_38.frame = (w3Frame *)0x0;
  local_38.label.arity = 0;
  local_38.label.continuation = 0;
  local_38.tag = Tag_Value;
  local_38.value.tag = Tag_i64;
  local_38.value._1_7_ = 0;
  w3Stack::push_value(&this->super_w3Stack,&local_38);
  return;
}

Assistant:

INTERP (i64_Load32s)
{
    push_i64 (*(int32_t*)LoadStore (4));
}